

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O2

bool __thiscall QFileInfo::isJunction(QFileInfo *this)

{
  QFileInfoPrivate *this_00;
  uint uVar1;
  
  this_00 = (this->d_ptr).d.ptr;
  if ((*(uint *)&this_00->field_0x1d8 >> 0x1e & 1) == 0) {
    if ((this_00->fileEngine)._M_t.
        super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
        super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
        super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl !=
        (QAbstractFileEngine *)0x0) {
      uVar1 = QFileInfoPrivate::getFileFlags(this_00,(FileFlags)0x10000);
      return uVar1 != 0;
    }
    if ((-1 < (int)*(uint *)&this_00->field_0x1d8) ||
       ((*(byte *)((long)&(this_00->metaData).knownFlagsMask.
                          super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2) & 1) == 0))
    {
      QFileSystemEngine::fillMetaData(&this_00->fileEntry,&this_00->metaData,(MetaDataFlags)0x10000)
      ;
    }
  }
  return false;
}

Assistant:

bool QFileInfo::isJunction() const
{
    Q_D(const QFileInfo);
    return d->checkAttribute<bool>(
            QFileSystemMetaData::LegacyLinkType,
            [d]() { return d->metaData.isJunction(); },
            [d]() { return d->getFileFlags(QAbstractFileEngine::LinkType); });
}